

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O3

void __thiscall TPZSFMatrix<long_double>::TPZSFMatrix(TPZSFMatrix<long_double> *this,int64_t dim)

{
  int iVar1;
  ulong uVar2;
  longdouble *plVar3;
  int64_t iVar4;
  undefined4 extraout_var;
  long lVar5;
  longdouble *plVar6;
  longdouble *dst;
  
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = dim;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = dim;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZSFMatrix_01868de0;
  uVar2 = (dim + 1) * dim >> 1;
  plVar3 = (longdouble *)operator_new__(-(ulong)(uVar2 >> 0x3c != 0) | uVar2 << 4);
  this->fElem = plVar3;
  iVar4 = TPZBaseMatrix::Dim((TPZBaseMatrix *)this);
  iVar1 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  lVar5 = (CONCAT44(extraout_var,iVar1) + 1) * iVar4 >> 1;
  if (0 < lVar5) {
    plVar6 = plVar3 + lVar5;
    do {
      *plVar3 = (longdouble)0;
      plVar3 = plVar3 + 1;
    } while (plVar3 < plVar6);
  }
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = '\0';
  return;
}

Assistant:

TPZSFMatrix<TVar> ::TPZSFMatrix(const int64_t dim )
: TPZRegisterClassId(&TPZSFMatrix::ClassId),
TPZMatrix<TVar>( dim, dim )
{
    int64_t size = Size();
	fElem = new TVar[ size ] ;
	
	if ( fElem == NULL )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Constructor <memory allocation error>." );
	
	// Zera a Matriz.
	Zero();
}